

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-parser.c
# Opt level: O2

bc_trie_t * blogc_source_parse(char *src,size_t src_len,int toctree_maxdepth,bc_error_t **err)

{
  byte bVar1;
  int iVar2;
  bc_trie_t *trie;
  void *pvVar3;
  char *pcVar4;
  bc_error_t *pbVar5;
  undefined4 in_register_00000014;
  size_t sVar6;
  char *pcVar7;
  bc_slist_t **headers_00;
  size_t sStack_a0;
  char *local_88;
  size_t local_80;
  bc_slist_t *headers;
  char *endl;
  long local_68;
  char *description;
  char *first_header;
  size_t local_50;
  size_t end_excerpt;
  bc_error_t **local_40;
  char *endptr;
  
  local_68 = CONCAT44(in_register_00000014,toctree_maxdepth);
  if ((err != (bc_error_t **)0x0) && (*err == (bc_error_t *)0x0)) {
    end_excerpt = 0;
    trie = bc_trie_new(free);
    local_50 = src_len - 1;
    local_88 = (char *)0x0;
    iVar2 = 1;
    local_80 = 0;
    sVar6 = 0;
    local_40 = err;
    do {
      if (src_len == sVar6) {
        if (*err == (bc_error_t *)0x0) {
          sVar6 = bc_trie_size(trie);
          if (sVar6 != 0) {
switchD_0010489f_default:
            pbVar5 = *err;
            goto LAB_001048f1;
          }
          switch(iVar2) {
          case 1:
            pcVar7 = "Your source file is empty.";
            break;
          case 2:
            pcVar7 = "Your last configuration key is missing \':\' and the value";
            break;
          case 3:
            pcVar7 = "Configuration value not provided for \'%s\'.";
            goto LAB_001048ba;
          case 4:
            pcVar7 = "No line ending after the configuration value for \'%s\'.";
LAB_001048ba:
            pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,src_len,pcVar7,local_88);
            goto LAB_001048ee;
          default:
            goto switchD_0010489f_default;
          }
          pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,src_len,pcVar7);
LAB_001048ee:
          *err = pbVar5;
LAB_001048f1:
          if (pbVar5 == (bc_error_t *)0x0) {
            return trie;
          }
        }
        break;
      }
      if (6 < iVar2 - 1U) goto LAB_0010450c;
      bVar1 = src[sVar6];
      switch(iVar2) {
      case 1:
        if ((bVar1 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) {
LAB_001043e8:
          iVar2 = 1;
          break;
        }
        if ((byte)(bVar1 + 0xbf) < 0x1a) {
          iVar2 = 2;
          local_80 = sVar6;
          break;
        }
        if (bVar1 == 0x2d) goto LAB_00104340;
        pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,sVar6,
                                 "Can\'t find a configuration key or the content separator.");
        *err = pbVar5;
        iVar2 = 1;
        goto LAB_0010450f;
      case 2:
        if (((byte)(bVar1 + 0xbf) < 0x1a) || (bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10)) {
          iVar2 = 2;
          break;
        }
        if (bVar1 == 0x3a) {
          pcVar7 = src + local_80;
          local_88 = bc_strndup(pcVar7,sVar6 - local_80);
          switch(sVar6 - local_80) {
          case 7:
            pcVar4 = "CONTENT";
            sStack_a0 = 7;
            break;
          case 8:
            pcVar4 = "FILENAME";
            sStack_a0 = 8;
            break;
          case 9:
            iVar2 = strncmp("PAGE_NEXT",pcVar7,9);
            if (iVar2 != 0) {
              pcVar4 = "PAGE_LAST";
              sStack_a0 = 9;
              break;
            }
            goto LAB_00104840;
          case 10:
            pcVar4 = "PAGE_FIRST";
            sStack_a0 = 10;
            break;
          default:
            goto switchD_0010459b_caseD_b;
          case 0xc:
            pcVar4 = "PAGE_CURRENT";
            sStack_a0 = 0xc;
            break;
          case 0xd:
            iVar2 = strncmp("PAGE_PREVIOUS",pcVar7,0xd);
            if (iVar2 == 0) goto LAB_00104840;
            pcVar4 = "BLOGC_VERSION";
            sStack_a0 = 0xd;
            break;
          case 0xe:
            pcVar4 = "DATE_FORMATTED";
            sStack_a0 = 0xe;
            break;
          case 0x13:
            pcVar4 = "DATE_LAST_FORMATTED";
            sStack_a0 = 0x13;
            break;
          case 0x14:
            pcVar4 = "DATE_FIRST_FORMATTED";
            sStack_a0 = 0x14;
          }
          iVar2 = strncmp(pcVar4,pcVar7,sStack_a0);
          if (iVar2 != 0) {
switchD_0010459b_caseD_b:
            iVar2 = 3;
            break;
          }
LAB_00104840:
          pbVar5 = bc_error_new_printf(BLOGC_ERROR_SOURCE_PARSER,
                                       "\'%s\' variable is forbidden in source files. It will be set for you by the compiler."
                                       ,local_88);
        }
        else {
          pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,sVar6,
                                   "Invalid configuration key.");
        }
        *err = pbVar5;
        iVar2 = 2;
        goto LAB_0010450f;
      case 3:
        if ((bVar1 == 10) || (bVar1 == 0xd)) {
          pcVar7 = bc_strdup("");
          bc_trie_insert(trie,local_88,pcVar7);
LAB_001043d3:
          free(local_88);
          local_88 = (char *)0x0;
          goto LAB_001043e8;
        }
        iVar2 = 4;
        local_80 = sVar6;
        break;
      case 4:
        if ((bVar1 == 0xd) || (bVar1 == 10)) {
          pcVar7 = bc_strndup(src + local_80,sVar6 - local_80);
          pcVar4 = bc_str_strip(pcVar7);
          pcVar4 = bc_strdup(pcVar4);
          bc_trie_insert(trie,local_88,pcVar4);
          free(pcVar7);
          err = local_40;
          goto LAB_001043d3;
        }
        iVar2 = 4;
        break;
      case 5:
        if ((bVar1 == 10) || (bVar1 == 0xd)) {
LAB_00104423:
          iVar2 = 6;
        }
        else {
          if (bVar1 != 0x2d) {
            pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,sVar6,
                                     "Invalid content separator. Must be more than one \'-\' characters."
                                    );
            *err = pbVar5;
            iVar2 = 5;
            goto LAB_0010450f;
          }
LAB_00104340:
          iVar2 = 5;
        }
        break;
      case 6:
        if ((bVar1 == 10) || (bVar1 == 0xd)) goto LAB_00104423;
        iVar2 = 7;
        local_80 = sVar6;
        break;
      case 7:
        if (local_50 == sVar6) {
          pcVar7 = bc_strndup(src + local_80,src_len - local_80);
          bc_trie_insert(trie,"RAW_CONTENT",pcVar7);
          first_header = (char *)0x0;
          description = (char *)0x0;
          endl = (char *)0x0;
          headers = (bc_slist_t *)0x0;
          pvVar3 = bc_trie_lookup(trie,"TOCTREE");
          headers_00 = (bc_slist_t **)0x0;
          if (pvVar3 == (void *)0x0) {
            headers_00 = &headers;
          }
          pcVar7 = blogc_content_parse(pcVar7,&end_excerpt,&first_header,&description,&endl,
                                       headers_00);
          if (first_header != (char *)0x0) {
            pvVar3 = bc_trie_lookup(trie,"FIRST_HEADER");
            if (pvVar3 == (void *)0x0) {
              bc_trie_insert(trie,"FIRST_HEADER",first_header);
            }
            else {
              free(first_header);
            }
          }
          if (description != (char *)0x0) {
            pvVar3 = bc_trie_lookup(trie,"DESCRIPTION");
            if (pvVar3 == (void *)0x0) {
              bc_trie_insert(trie,"DESCRIPTION",description);
            }
            else {
              free(description);
            }
          }
          if (headers == (bc_slist_t *)0x0) {
LAB_001046e9:
            free(endl);
            bc_trie_insert(trie,"CONTENT",pcVar7);
            if (end_excerpt == 0) {
              pcVar7 = bc_strdup(pcVar7);
            }
            else {
              pcVar7 = bc_strndup(pcVar7,end_excerpt);
            }
            bc_trie_insert(trie,"EXCERPT",pcVar7);
          }
          else {
            pcVar4 = (char *)bc_trie_lookup(trie,"TOCTREE_MAXDEPTH");
            if (((pcVar4 == (char *)0x0) || (local_68 = strtol(pcVar4,&endptr,10), *pcVar4 == '\0'))
               || (*endptr == '\0')) {
              pcVar4 = blogc_toctree_render(headers,(int)local_68,endl);
              blogc_toctree_free(headers);
              if (pcVar4 != (char *)0x0) {
                bc_trie_insert(trie,"TOCTREE",pcVar4);
              }
              goto LAB_001046e9;
            }
            pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,local_50,
                                     "Invalid value for \'TOCTREE_MAXDEPTH\' variable: %s.",pcVar4);
            *err = pbVar5;
            blogc_toctree_free(headers);
            free(endl);
            free(pcVar7);
          }
          iVar2 = 7;
        }
        else {
          iVar2 = 7;
        }
      }
LAB_0010450c:
      pbVar5 = *err;
LAB_0010450f:
      sVar6 = sVar6 + 1;
    } while (pbVar5 == (bc_error_t *)0x0);
    free(local_88);
    bc_trie_free(trie);
  }
  return (bc_trie_t *)0x0;
}

Assistant:

bc_trie_t*
blogc_source_parse(const char *src, size_t src_len, int toctree_maxdepth,
    bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t current = 0;
    size_t start = 0;
    size_t end_excerpt = 0;

    char *key = NULL;
    char *tmp = NULL;
    char *content = NULL;
    bc_trie_t *rv = bc_trie_new(free);

    blogc_source_parser_state_t state = SOURCE_START;

    while (current < src_len) {
        char c = src[current];

        switch (state) {

            case SOURCE_START:
                if (c == ' ' || c == '\t' || c == '\n' || c == '\r')
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = SOURCE_CONFIG_KEY;
                    start = current;
                    break;
                }
                if (c == '-') {
                    state = SOURCE_SEPARATOR;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current,
                    "Can't find a configuration key or the content separator.");
                break;

            case SOURCE_CONFIG_KEY:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (c == ':') {
                    key = bc_strndup(src + start, current - start);
                    if (((current - start == 8) &&
                         (0 == strncmp("FILENAME", src + start, 8))) ||
                        ((current - start == 7) &&
                         (0 == strncmp("CONTENT", src + start, 7))) ||
                        ((current - start == 14) &&
                         (0 == strncmp("DATE_FORMATTED", src + start, 14))) ||
                        ((current - start == 20) &&
                         (0 == strncmp("DATE_FIRST_FORMATTED", src + start, 20))) ||
                        ((current - start == 19) &&
                         (0 == strncmp("DATE_LAST_FORMATTED", src + start, 19))) ||
                        ((current - start == 10) &&
                         (0 == strncmp("PAGE_FIRST", src + start, 10))) ||
                        ((current - start == 13) &&
                         (0 == strncmp("PAGE_PREVIOUS", src + start, 13))) ||
                        ((current - start == 12) &&
                         (0 == strncmp("PAGE_CURRENT", src + start, 12))) ||
                        ((current - start == 9) &&
                         (0 == strncmp("PAGE_NEXT", src + start, 9))) ||
                        ((current - start == 9) &&
                         (0 == strncmp("PAGE_LAST", src + start, 9))) ||
                        ((current - start == 13) &&
                         (0 == strncmp("BLOGC_VERSION", src + start, 13))))
                    {
                        *err = bc_error_new_printf(BLOGC_ERROR_SOURCE_PARSER,
                            "'%s' variable is forbidden in source files. It will "
                            "be set for you by the compiler.", key);
                        break;
                    }
                    state = SOURCE_CONFIG_VALUE_START;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Invalid configuration key.");
                break;

            case SOURCE_CONFIG_VALUE_START:
                if (c != '\n' && c != '\r') {
                    state = SOURCE_CONFIG_VALUE;
                    start = current;
                    break;
                }
                bc_trie_insert(rv, key, bc_strdup(""));
                free(key);
                key = NULL;
                state = SOURCE_START;
                break;

            case SOURCE_CONFIG_VALUE:
                if (c == '\n' || c == '\r') {
                    tmp = bc_strndup(src + start, current - start);
                    bc_trie_insert(rv, key, bc_strdup(bc_str_strip(tmp)));
                    free(tmp);
                    free(key);
                    key = NULL;
                    state = SOURCE_START;
                }
                break;

            case SOURCE_SEPARATOR:
                if (c == '-')
                    break;
                if (c == '\n' || c == '\r') {
                    state = SOURCE_CONTENT_START;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current,
                    "Invalid content separator. Must be more than one '-' characters.");
                break;

            case SOURCE_CONTENT_START:
                if (c == '\n' || c == '\r')
                    break;
                start = current;
                state = SOURCE_CONTENT;
                break;

            case SOURCE_CONTENT:
                if (current == (src_len - 1)) {
                    tmp = bc_strndup(src + start, src_len - start);
                    bc_trie_insert(rv, "RAW_CONTENT", tmp);
                    char *first_header = NULL;
                    char *description = NULL;
                    char *endl = NULL;
                    bc_slist_t *headers = NULL;
                    bool read_headers = (NULL == bc_trie_lookup(rv, "TOCTREE"));
                    content = blogc_content_parse(tmp, &end_excerpt,
                        &first_header, &description, &endl, read_headers ? &headers : NULL);
                    if (first_header != NULL) {
                        // do not override source-provided first_header.
                        if (NULL == bc_trie_lookup(rv, "FIRST_HEADER")) {
                            // no need to free, because we are transfering memory
                            // ownership to the trie.
                            bc_trie_insert(rv, "FIRST_HEADER", first_header);
                        }
                        else {
                            free(first_header);
                        }
                    }
                    if (description != NULL) {
                        // do not override source-provided description.
                        if (NULL == bc_trie_lookup(rv, "DESCRIPTION")) {
                            // no need to free, because we are transfering memory
                            // ownership to the trie.
                            bc_trie_insert(rv, "DESCRIPTION", description);
                        }
                        else {
                            free(description);
                        }
                    }
                    if (headers != NULL) {
                        // we already validated that the user do not defined TOCTREE
                        // manually in source file.
                        const char *maxdepth = bc_trie_lookup(rv, "TOCTREE_MAXDEPTH");
                        if (maxdepth != NULL) {
                            char *endptr;
                            toctree_maxdepth = strtol(maxdepth, &endptr, 10);
                            if (*maxdepth != '\0' && *endptr != '\0') {
                                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                                    current,
                                    "Invalid value for 'TOCTREE_MAXDEPTH' variable: %s.",
                                    maxdepth);
                                blogc_toctree_free(headers);
                                free(endl);
                                free(content);
                                break;
                            }
                        }
                        char *toctree = blogc_toctree_render(headers, toctree_maxdepth, endl);
                        blogc_toctree_free(headers);
                        if (toctree != NULL) {
                            bc_trie_insert(rv, "TOCTREE", toctree);
                        }
                    }
                    free(endl);
                    bc_trie_insert(rv, "CONTENT", content);
                    bc_trie_insert(rv, "EXCERPT", end_excerpt == 0 ?
                        bc_strdup(content) : bc_strndup(content, end_excerpt));
                }
                break;
        }

        if (*err != NULL)
            break;

        current++;
    }

    if (*err == NULL && bc_trie_size(rv) == 0) {

        // ok, nothing found in the config trie, but no error set either.
        // let's try to be nice with the users and provide some reasonable
        // output. :)
        switch (state) {
            case SOURCE_START:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Your source file is empty.");
                break;
            case SOURCE_CONFIG_KEY:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Your last configuration key is missing ':' and "
                    "the value");
                break;
            case SOURCE_CONFIG_VALUE_START:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Configuration value not provided for '%s'.",
                    key);
                break;
            case SOURCE_CONFIG_VALUE:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "No line ending after the configuration value for "
                    "'%s'.", key);
                break;
            case SOURCE_SEPARATOR:
            case SOURCE_CONTENT_START:
            case SOURCE_CONTENT:
                break;  // won't happen, and if even happen, shouldn't be fatal
        }
    }

    if (*err != NULL) {
        free(key);
        bc_trie_free(rv);
        return NULL;
    }

    return rv;
}